

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal128.c
# Opt level: O3

char * decimal128ToString(decimal128 *d128,char *string)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  byte *pbVar13;
  ulong uVar14;
  
  uVar4 = *(uint *)d128->bytes;
  uVar3 = *(uint *)(d128->bytes + 4);
  uVar7 = *(uint *)(d128->bytes + 8);
  uVar6 = *(uint *)(d128->bytes + 0xc);
  pcVar8 = string;
  if ((int)uVar6 < 0) {
    pcVar8 = string + 1;
    *string = '-';
  }
  uVar14 = (ulong)(uVar6 >> 0x18 & 0x7c);
  iVar10 = *(int *)((long)COMBMSD + uVar14);
  iVar1 = *(int *)((long)COMBEXP + uVar14);
  if (iVar1 == 3) {
    if (iVar10 == 0) {
      builtin_strncpy(pcVar8,"Infinity",9);
      return string;
    }
    if ((uVar6 >> 0x19 & 1) != 0) {
      *pcVar8 = 's';
      pcVar8 = pcVar8 + 1;
    }
    builtin_strncpy(pcVar8,"NaN",4);
    pcVar9 = pcVar8 + 3;
    pcVar8 = pcVar9;
    iVar1 = 0;
    if (((uVar4 == 0) && (iVar1 = 0, uVar3 == 0)) &&
       (iVar1 = 0, (uVar6 & 0x3ffff) == 0 && uVar7 == 0)) {
      return string;
    }
  }
  else {
    iVar1 = (uVar6 >> 0xe & 0xfff) + iVar1 * 0x1000 + -0x1820;
    pcVar9 = pcVar8;
    if (iVar10 != 0) {
      *pcVar8 = (char)iVar10 + '0';
      pcVar9 = pcVar8 + 1;
    }
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar6 >> 3 & 0x7fe)) * 4;
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[lVar11];
    pcVar9 = pcVar8;
    if (uVar14 != 0) {
      *(undefined4 *)pcVar8 = *(undefined4 *)("" + lVar11 + (4 - uVar14));
      pcVar9 = pcVar8 + uVar14;
    }
  }
  else {
    *(undefined4 *)pcVar9 = *(undefined4 *)("" + lVar11 + 1);
    pcVar9 = pcVar9 + 3;
  }
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[(ulong)DPD2BIN[(uVar6 & 0xf) << 6 | uVar7 >> 0x1a] * 4];
    pcVar9 = pcVar8;
    if (uVar14 != 0) {
      *(undefined4 *)pcVar8 =
           *(undefined4 *)
            ("" + (ulong)DPD2BIN[(uVar6 & 0xf) << 6 | uVar7 >> 0x1a] * 4 + (4 - uVar14));
      pcVar9 = pcVar8 + uVar14;
    }
  }
  else {
    *(undefined4 *)pcVar9 =
         *(undefined4 *)("" + (ulong)DPD2BIN[(uVar6 & 0xf) << 6 | uVar7 >> 0x1a] * 4 + 1);
    pcVar9 = pcVar9 + 3;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar7 >> 0xf & 0x7fe)) * 4;
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[lVar11];
    pcVar9 = pcVar8;
    if (uVar14 != 0) {
      *(undefined4 *)pcVar8 = *(undefined4 *)("" + lVar11 + (4 - uVar14));
      pcVar9 = pcVar8 + uVar14;
    }
  }
  else {
    *(undefined4 *)pcVar9 = *(undefined4 *)("" + lVar11 + 1);
    pcVar9 = pcVar9 + 3;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar7 >> 5 & 0x7fe)) * 4;
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[lVar11];
    if (uVar14 != 0) {
      pbVar13 = "" + lVar11 + (4 - uVar14);
      goto LAB_00b1e109;
    }
  }
  else {
    pbVar13 = "" + lVar11 + 1;
    uVar14 = 3;
LAB_00b1e109:
    *(undefined4 *)pcVar9 = *(undefined4 *)pbVar13;
    pcVar9 = pcVar9 + uVar14;
  }
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[(ulong)DPD2BIN[(uVar7 & 0x3f) << 4 | uVar3 >> 0x1c] * 4];
    if (uVar14 != 0) {
      pbVar13 = "" + (ulong)DPD2BIN[(uVar7 & 0x3f) << 4 | uVar3 >> 0x1c] * 4 + (4 - uVar14);
      goto LAB_00b1e14e;
    }
  }
  else {
    pbVar13 = "" + (ulong)DPD2BIN[(uVar7 & 0x3f) << 4 | uVar3 >> 0x1c] * 4 + 1;
    uVar14 = 3;
LAB_00b1e14e:
    *(undefined4 *)pcVar9 = *(undefined4 *)pbVar13;
    pcVar9 = pcVar9 + uVar14;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar3 >> 0x11 & 0x7fe)) * 4;
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[lVar11];
    if (uVar14 != 0) {
      pbVar13 = "" + lVar11 + (4 - uVar14);
      goto LAB_00b1e195;
    }
  }
  else {
    pbVar13 = "" + lVar11 + 1;
    uVar14 = 3;
LAB_00b1e195:
    *(undefined4 *)pcVar9 = *(undefined4 *)pbVar13;
    pcVar9 = pcVar9 + uVar14;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar3 >> 7 & 0x7fe)) * 4;
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[lVar11];
    if (uVar14 != 0) {
      pbVar13 = "" + lVar11 + (4 - uVar14);
      goto LAB_00b1e1dc;
    }
  }
  else {
    pbVar13 = "" + lVar11 + 1;
    uVar14 = 3;
LAB_00b1e1dc:
    *(undefined4 *)pcVar9 = *(undefined4 *)pbVar13;
    pcVar9 = pcVar9 + uVar14;
  }
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[(ulong)DPD2BIN[(uVar3 & 0xff) << 2 | uVar4 >> 0x1e] * 4];
    if (uVar14 != 0) {
      pbVar13 = "" + (ulong)DPD2BIN[(uVar3 & 0xff) << 2 | uVar4 >> 0x1e] * 4 + (4 - uVar14);
      goto LAB_00b1e221;
    }
  }
  else {
    pbVar13 = "" + (ulong)DPD2BIN[(uVar3 & 0xff) << 2 | uVar4 >> 0x1e] * 4 + 1;
    uVar14 = 3;
LAB_00b1e221:
    *(undefined4 *)pcVar9 = *(undefined4 *)pbVar13;
    pcVar9 = pcVar9 + uVar14;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar4 >> 0x13 & 0x7fe)) * 4;
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[lVar11];
    if (uVar14 != 0) {
      pbVar13 = "" + lVar11 + (4 - uVar14);
      goto LAB_00b1e268;
    }
  }
  else {
    pbVar13 = "" + lVar11 + 1;
    uVar14 = 3;
LAB_00b1e268:
    *(undefined4 *)pcVar9 = *(undefined4 *)pbVar13;
    pcVar9 = pcVar9 + uVar14;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar4 >> 9 & 0x7fe)) * 4;
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[lVar11];
    if (uVar14 != 0) {
      pbVar13 = "" + lVar11 + (4 - uVar14);
      goto LAB_00b1e2af;
    }
  }
  else {
    pbVar13 = "" + lVar11 + 1;
    uVar14 = 3;
LAB_00b1e2af:
    *(undefined4 *)pcVar9 = *(undefined4 *)pbVar13;
    pcVar9 = pcVar9 + uVar14;
  }
  if (pcVar9 == pcVar8) {
    uVar14 = (ulong)""[(ulong)DPD2BIN[uVar4 & 0x3ff] * 4];
    if (uVar14 == 0) goto LAB_00b1e2f1;
    pbVar13 = "" + (ulong)DPD2BIN[uVar4 & 0x3ff] * 4 + (4 - uVar14);
  }
  else {
    pbVar13 = "" + (ulong)DPD2BIN[uVar4 & 0x3ff] * 4 + 1;
    uVar14 = 3;
  }
  *(undefined4 *)pcVar9 = *(undefined4 *)pbVar13;
  pcVar9 = pcVar9 + uVar14;
LAB_00b1e2f1:
  if (pcVar9 == pcVar8) {
    *pcVar9 = '0';
    pcVar9 = pcVar9 + 1;
  }
  if (iVar1 != 0) {
    iVar10 = (int)pcVar9 - (int)pcVar8;
    uVar4 = iVar1 + iVar10;
    uVar3 = 1;
    if ((int)uVar4 >= -5 && 0 >= iVar1) {
      uVar3 = uVar4;
    }
    uVar7 = iVar1 + -1 + iVar10;
    uVar6 = 0;
    if ((int)uVar4 < -5 || 0 < iVar1) {
      uVar6 = uVar7;
    }
    if ((int)uVar3 < 1) {
      pcVar2 = pcVar9 + -1;
      pcVar9[2 - (long)(int)uVar3] = '\0';
      if (pcVar8 <= pcVar2) {
        do {
          pcVar2[2 - (long)(int)uVar3] = *pcVar2;
          pcVar2 = pcVar2 + -1;
        } while (pcVar8 <= pcVar2);
      }
      pcVar8[0] = '0';
      pcVar8[1] = '.';
      if (-1 < (int)uVar3) {
        return string;
      }
      memset(pcVar8 + 2,0x30,(ulong)-uVar3);
      return string;
    }
    pcVar2 = pcVar9;
    if (pcVar8 + uVar3 < pcVar9) {
      do {
        pcVar5 = pcVar2 + -1;
        *pcVar2 = pcVar2[-1];
        pcVar12 = pcVar2 + -2;
        pcVar2 = pcVar5;
      } while (pcVar8 + uVar3 <= pcVar12);
      *pcVar5 = '.';
      pcVar9 = pcVar9 + 1;
    }
    if (uVar6 != 0) {
      pcVar9[0] = 'E';
      pcVar9[1] = '+';
      if ((int)uVar6 < 0) {
        pcVar9[1] = '-';
        uVar7 = -uVar6;
      }
      if ((int)uVar7 < 1000) {
        uVar14 = (ulong)""[(ulong)uVar7 * 4];
        *(undefined4 *)(pcVar9 + 2) = *(undefined4 *)("" + (ulong)uVar7 * 4 + (4 - uVar14));
        pcVar9 = pcVar9 + 2 + uVar14;
      }
      else {
        uVar4 = (uVar7 >> 3) * 0x419 >> 0x11;
        pcVar9[2] = (char)uVar4 + '0';
        *(undefined4 *)(pcVar9 + 3) =
             *(undefined4 *)("" + (long)(int)(uVar4 * -1000 + uVar7) * 4 + 1);
        pcVar9 = pcVar9 + 6;
      }
    }
  }
  *pcVar9 = '\0';
  return string;
}

Assistant:

char * decimal128ToString(const decimal128 *d128, char *string){
  uInt msd;			   /* coefficient MSD */
  Int  exp;			   /* exponent top two bits or full */
  uInt comb;			   /* combination field */
  char *cstart;			   /* coefficient start */
  char *c;			   /* output pointer in string */
  const uInt *pu;		   /* work */
  char *s, *t;			   /* .. (source, target) */
  Int  dpd;			   /* .. */
  Int  pre, e;			   /* .. */
  const uByte *u;		   /* .. */

  uInt sourar[4];		   /* source 128-bit */
  #define sourhi sourar[3]	   /* name the word with the sign */
  #define sourmh sourar[2]	   /* and the mid-high word */
  #define sourml sourar[1]	   /* and the mod-low word */
  #define sourlo sourar[0]	   /* and the lowest word */

  /* load source from storage; this is endian */
  pu=(const uInt *)d128->bytes;	   /* overlay */
  if (DECLITEND) {
    sourlo=pu[0];		   /* directly load the low int */
    sourml=pu[1];		   /* then the mid-low */
    sourmh=pu[2];		   /* then the mid-high */
    sourhi=pu[3];		   /* then the high int */
    }
   else {
    sourhi=pu[0];		   /* directly load the high int */
    sourmh=pu[1];		   /* then the mid-high */
    sourml=pu[2];		   /* then the mid-low */
    sourlo=pu[3];		   /* then the low int */
    }

  c=string;			   /* where result will go */
  if (((Int)sourhi)<0) *c++='-';   /* handle sign */

  comb=(sourhi>>26)&0x1f;	   /* combination field */
  msd=COMBMSD[comb];		   /* decode the combination field */
  exp=COMBEXP[comb];		   /* .. */

  if (exp==3) {
    if (msd==0) {		   /* infinity */
      strcpy(c,	  "Inf");
      strcpy(c+3, "inity");
      return string;		   /* easy */
      }
    if (sourhi&0x02000000) *c++='s'; /* sNaN */
    strcpy(c, "NaN");		   /* complete word */
    c+=3;			   /* step past */
    if (sourlo==0 && sourml==0 && sourmh==0
     && (sourhi&0x0003ffff)==0) return string; /* zero payload */
    /* otherwise drop through to add integer; set correct exp */
    exp=0; msd=0;		   /* setup for following code */
    }
   else exp=(exp<<12)+((sourhi>>14)&0xfff)-DECIMAL128_Bias; /* unbiased */

  /* convert 34 digits of significand to characters */
  cstart=c;			   /* save start of coefficient */
  if (msd) *c++='0'+(char)msd;	   /* non-zero most significant digit */

  /* Now decode the declets.  After extracting each one, it is */
  /* decoded to binary and then to a 4-char sequence by table lookup; */
  /* the 4-chars are a 1-char length (significant digits, except 000 */
  /* has length 0).  This allows us to left-align the first declet */
  /* with non-zero content, then remaining ones are full 3-char */
  /* length.  We use fixed-length memcpys because variable-length */
  /* causes a subroutine call in GCC.  (These are length 4 for speed */
  /* and are safe because the array has an extra terminator byte.) */
  #define dpd2char u=&BIN2CHAR[DPD2BIN[dpd]*4];			  \
		   if (c!=cstart) {memcpy(c, u+1, 4); c+=3;}	  \
		    else if (*u)  {memcpy(c, u+4-*u, 4); c+=*u;}
  dpd=(sourhi>>4)&0x3ff;		     /* declet 1 */
  dpd2char;
  dpd=((sourhi&0xf)<<6) | (sourmh>>26);	     /* declet 2 */
  dpd2char;
  dpd=(sourmh>>16)&0x3ff;		     /* declet 3 */
  dpd2char;
  dpd=(sourmh>>6)&0x3ff;		     /* declet 4 */
  dpd2char;
  dpd=((sourmh&0x3f)<<4) | (sourml>>28);     /* declet 5 */
  dpd2char;
  dpd=(sourml>>18)&0x3ff;		     /* declet 6 */
  dpd2char;
  dpd=(sourml>>8)&0x3ff;		     /* declet 7 */
  dpd2char;
  dpd=((sourml&0xff)<<2) | (sourlo>>30);     /* declet 8 */
  dpd2char;
  dpd=(sourlo>>20)&0x3ff;		     /* declet 9 */
  dpd2char;
  dpd=(sourlo>>10)&0x3ff;		     /* declet 10 */
  dpd2char;
  dpd=(sourlo)&0x3ff;			     /* declet 11 */
  dpd2char;

  if (c==cstart) *c++='0';	   /* all zeros -- make 0 */

  if (exp==0) {			   /* integer or NaN case -- easy */
    *c='\0';			   /* terminate */
    return string;
    }

  /* non-0 exponent */
  e=0;				   /* assume no E */
  pre=c-cstart+exp;
  /* [here, pre-exp is the digits count (==1 for zero)] */
  if (exp>0 || pre<-5) {	   /* need exponential form */
    e=pre-1;			   /* calculate E value */
    pre=1;			   /* assume one digit before '.' */
    } /* exponential form */

  /* modify the coefficient, adding 0s, '.', and E+nn as needed */
  s=c-1;			   /* source (LSD) */
  if (pre>0) {			   /* ddd.ddd (plain), perhaps with E */
    char *dotat=cstart+pre;
    if (dotat<c) {		   /* if embedded dot needed... */
      t=c;				/* target */
      for (; s>=dotat; s--, t--) *t=*s; /* open the gap; leave t at gap */
      *t='.';				/* insert the dot */
      c++;				/* length increased by one */
      }

    /* finally add the E-part, if needed; it will never be 0, and has */
    /* a maximum length of 4 digits */
    if (e!=0) {
      *c++='E';			   /* starts with E */
      *c++='+';			   /* assume positive */
      if (e<0) {
	*(c-1)='-';		   /* oops, need '-' */
	e=-e;			   /* uInt, please */
	}
      if (e<1000) {		   /* 3 (or fewer) digits case */
	u=&BIN2CHAR[e*4];	   /* -> length byte */
	memcpy(c, u+4-*u, 4);	   /* copy fixed 4 characters [is safe] */
	c+=*u;			   /* bump pointer appropriately */
	}
       else {			   /* 4-digits */
	Int thou=((e>>3)*1049)>>17; /* e/1000 */
	Int rem=e-(1000*thou);	    /* e%1000 */
	*c++='0'+(char)thou;
	u=&BIN2CHAR[rem*4];	   /* -> length byte */
	memcpy(c, u+1, 4);	   /* copy fixed 3+1 characters [is safe] */
	c+=3;			   /* bump pointer, always 3 digits */
	}
      }
    *c='\0';			   /* add terminator */
    /*printf("res %s\n", string); */
    return string;
    } /* pre>0 */

  /* -5<=pre<=0: here for plain 0.ddd or 0.000ddd forms (can never have E) */
  t=c+1-pre;
  *(t+1)='\0';				/* can add terminator now */
  for (; s>=cstart; s--, t--) *t=*s;	/* shift whole coefficient right */
  c=cstart;
  *c++='0';				/* always starts with 0. */
  *c++='.';
  for (; pre<0; pre++) *c++='0';	/* add any 0's after '.' */
  /*printf("res %s\n", string); */
  return string;
  }